

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::MergeReturnPass::MergeReturnBlocks
          (MergeReturnPass *this,Function *function,
          vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *return_blocks)

{
  initializer_list<unsigned_int> init_list;
  initializer_list<spvtools::opt::Operand> __l;
  initializer_list<unsigned_int> init_list_00;
  initializer_list<spvtools::opt::Operand> __l_00;
  initializer_list<unsigned_int> init_list_01;
  initializer_list<unsigned_int> init_list_02;
  bool bVar1;
  Op OVar2;
  uint32_t res_id;
  size_type sVar3;
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> *pUVar4;
  DebugScope *pDVar5;
  Instruction *pIVar6;
  IRContext *pIVar7;
  pointer pvVar8;
  DefUseManager *pDVar9;
  reference ppBVar10;
  Operand *local_388;
  Operand *local_328;
  allocator<spvtools::opt::Operand> local_315;
  uint32_t local_314;
  iterator local_310;
  undefined8 local_308;
  SmallVector<unsigned_int,_2UL> local_300;
  Operand local_2d8;
  iterator local_2a8;
  _func_int **local_2a0;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_298;
  undefined1 local_280 [16];
  BasicBlock *local_270;
  BasicBlock *block_1;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *__range2_1;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_248
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  return_inst_1;
  iterator ret;
  allocator<spvtools::opt::Operand> local_22d;
  undefined1 local_22c [12];
  Instruction *local_220;
  SmallVector<unsigned_int,_2UL> local_218;
  Operand local_1f0;
  DebugScope local_1c0;
  _func_int **local_1b8;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> local_1b0;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_198
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  return_inst;
  iterator phiIter;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_180
  ;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> phi_inst;
  uint32_t phi_type_id;
  uint32_t phi_result_id;
  undefined8 local_160;
  SmallVector<unsigned_int,_2UL> local_158;
  Operand local_130;
  undefined1 local_100 [72];
  Operand local_b8;
  undefined1 local_88 [16];
  BasicBlock *block;
  const_iterator __end2;
  const_iterator __begin2;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *__range2;
  vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> phi_ops;
  undefined1 local_38 [8];
  UptrVectorIterator<spvtools::opt::BasicBlock,_false> ret_block_iter;
  uint32_t return_id;
  vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
  *return_blocks_local;
  Function *function_local;
  MergeReturnPass *this_local;
  
  sVar3 = std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
          size(return_blocks);
  if (1 < sVar3) {
    CreateReturnBlock(this);
    ret_block_iter.iterator_._M_current._4_4_ = BasicBlock::id(this->final_return_block_);
    join_0x00000010_0x00000000_ = opt::Function::end(function);
    pUVar4 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator--
                       ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)
                        &phi_ops.
                         super__Vector_base<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
    local_38 = (undefined1  [8])pUVar4->container_;
    ret_block_iter.container_ = (UptrVector *)(pUVar4->iterator_)._M_current;
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&__range2)
    ;
    __end2 = std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
             ::begin(return_blocks);
    block = (BasicBlock *)
            std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
            end(return_blocks);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<spvtools::opt::BasicBlock_*const_*,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
                                       *)&block), bVar1) {
      pDVar5 = (DebugScope *)
               __gnu_cxx::
               __normal_iterator<spvtools::opt::BasicBlock_*const_*,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
               ::operator*(&__end2);
      local_88._8_8_ = *pDVar5;
      BasicBlock::tail((BasicBlock *)local_88);
      pIVar6 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)local_88);
      OVar2 = opt::Instruction::opcode(pIVar6);
      if (OVar2 == OpReturnValue) {
        BasicBlock::tail((BasicBlock *)local_100);
        pIVar6 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator->
                           ((iterator_template<spvtools::opt::Instruction> *)local_100);
        local_100._12_4_ = opt::Instruction::GetSingleWordInOperand(pIVar6,0);
        local_100._16_8_ = local_100 + 0xc;
        local_100._24_8_ = (_func_int **)0x1;
        init_list_02._M_len = 1;
        init_list_02._M_array = (iterator)local_100._16_8_;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)(local_100 + 0x20),init_list_02);
        Operand::Operand(&local_b8,SPV_OPERAND_TYPE_ID,(OperandData *)(local_100 + 0x20));
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   &__range2,&local_b8);
        Operand::~Operand(&local_b8);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector
                  ((SmallVector<unsigned_int,_2UL> *)(local_100 + 0x20));
        phi_type_id = BasicBlock::id((BasicBlock *)local_88._8_8_);
        _phi_result_id = (Instruction *)&phi_type_id;
        local_160._0_1_ = true;
        local_160._1_7_ = 0;
        init_list_01._M_len = 1;
        init_list_01._M_array = (iterator)_phi_result_id;
        utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_158,init_list_01);
        Operand::Operand(&local_130,SPV_OPERAND_TYPE_ID,&local_158);
        std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::push_back
                  ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                   &__range2,&local_130);
        Operand::~Operand(&local_130);
        utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_158);
      }
      __gnu_cxx::
      __normal_iterator<spvtools::opt::BasicBlock_*const_*,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
      ::operator++(&__end2);
    }
    bVar1 = std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::empty
                      ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)
                       &__range2);
    if (bVar1) {
      pIVar6 = (Instruction *)::operator_new(0x70);
      pIVar7 = Pass::context((Pass *)this);
      opt::Instruction::Instruction(pIVar6,pIVar7,OpReturn);
      std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
      unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
                ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                  *)&local_248,pIVar6);
      pvVar8 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                         ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_38);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    *)&__range2_1,&local_248);
      BasicBlock::AddInstruction
                (pvVar8,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                         *)&__range2_1);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::~unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     *)&__range2_1);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::~unique_ptr(&local_248);
    }
    else {
      res_id = Pass::TakeNextId((Pass *)this);
      phi_inst._M_t.
      super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ._M_t.
      super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
      .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_ =
           opt::Function::type_id(function);
      pIVar6 = (Instruction *)::operator_new(0x70);
      pIVar7 = Pass::context((Pass *)this);
      opt::Instruction::Instruction
                (pIVar6,pIVar7,OpPhi,
                 phi_inst._M_t.
                 super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                 .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl._4_4_,
                 res_id,(OperandList *)&__range2);
      std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
      unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
                ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                  *)&local_180,pIVar6);
      pvVar8 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                         ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_38);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    *)&phiIter,&local_180);
      BasicBlock::AddInstruction
                (pvVar8,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                         *)&phiIter);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::~unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     *)&phiIter);
      UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_38);
      BasicBlock::tail((BasicBlock *)&return_inst);
      pIVar6 = (Instruction *)::operator_new(0x70);
      pIVar7 = Pass::context((Pass *)this);
      local_22c._4_8_ = local_22c;
      local_220 = (Instruction *)0x1;
      init_list_00._M_len = 1;
      init_list_00._M_array = (iterator)local_22c._4_8_;
      local_22c._0_4_ = res_id;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_218,init_list_00);
      Operand::Operand(&local_1f0,SPV_OPERAND_TYPE_ID,&local_218);
      local_1c0 = (DebugScope)&local_1f0;
      local_1b8 = (_func_int **)0x1;
      std::allocator<spvtools::opt::Operand>::allocator(&local_22d);
      __l_00._M_len = (size_type)local_1b8;
      __l_00._M_array = (iterator)local_1c0;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                (&local_1b0,__l_00,&local_22d);
      opt::Instruction::Instruction(pIVar6,pIVar7,OpReturnValue,0,0,&local_1b0);
      std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>::
      unique_ptr<std::default_delete<spvtools::opt::Instruction>,void>
                ((unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>
                  *)&local_198,pIVar6);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                (&local_1b0);
      std::allocator<spvtools::opt::Operand>::~allocator(&local_22d);
      local_328 = (Operand *)&local_1c0;
      do {
        local_328 = local_328 + -1;
        Operand::~Operand(local_328);
      } while (local_328 != &local_1f0);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_218);
      pvVar8 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                         ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_38);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                    *)&ret,&local_198);
      BasicBlock::AddInstruction
                (pvVar8,(unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                         *)&ret);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::~unique_ptr((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                     *)&ret);
      UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_38);
      BasicBlock::tail((BasicBlock *)&return_inst_1);
      pDVar9 = Pass::get_def_use_mgr((Pass *)this);
      pIVar6 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*
                         ((iterator_template<spvtools::opt::Instruction> *)&return_inst);
      analysis::DefUseManager::AnalyzeInstDefUse(pDVar9,pIVar6);
      pDVar9 = Pass::get_def_use_mgr((Pass *)this);
      pIVar6 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*
                         ((iterator_template<spvtools::opt::Instruction> *)&return_inst_1);
      analysis::DefUseManager::AnalyzeInstDef(pDVar9,pIVar6);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::~unique_ptr(&local_198);
      std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
      ::~unique_ptr(&local_180);
    }
    __end2_1 = std::
               vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
               begin(return_blocks);
    block_1 = (BasicBlock *)
              std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>
              ::end(return_blocks);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<spvtools::opt::BasicBlock_*const_*,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
                               *)&block_1), bVar1) {
      ppBVar10 = __gnu_cxx::
                 __normal_iterator<spvtools::opt::BasicBlock_*const_*,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
                 ::operator*(&__end2_1);
      local_270 = *ppBVar10;
      pIVar7 = Pass::context((Pass *)this);
      pIVar6 = BasicBlock::terminator(local_270);
      IRContext::ForgetUses(pIVar7,pIVar6);
      BasicBlock::tail((BasicBlock *)(local_280 + 8));
      pIVar6 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)(local_280 + 8));
      opt::Instruction::SetOpcode(pIVar6,OpBranch);
      BasicBlock::tail((BasicBlock *)local_280);
      pIVar6 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator->
                         ((iterator_template<spvtools::opt::Instruction> *)local_280);
      local_314 = ret_block_iter.iterator_._M_current._4_4_;
      local_310 = &local_314;
      local_308 = 1;
      init_list._M_len = 1;
      init_list._M_array = local_310;
      utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_300,init_list);
      Operand::Operand(&local_2d8,SPV_OPERAND_TYPE_ID,&local_300);
      local_2a8 = &local_2d8;
      local_2a0 = (_func_int **)0x1;
      std::allocator<spvtools::opt::Operand>::allocator(&local_315);
      __l._M_len = (size_type)local_2a0;
      __l._M_array = local_2a8;
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::vector
                (&local_298,__l,&local_315);
      opt::Instruction::ReplaceOperands(pIVar6,&local_298);
      std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
                (&local_298);
      std::allocator<spvtools::opt::Operand>::~allocator(&local_315);
      local_388 = (Operand *)&local_2a8;
      do {
        local_388 = local_388 + -1;
        Operand::~Operand(local_388);
      } while (local_388 != &local_2d8);
      utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_300);
      pDVar9 = Pass::get_def_use_mgr((Pass *)this);
      pIVar6 = BasicBlock::terminator(local_270);
      analysis::DefUseManager::AnalyzeInstUse(pDVar9,pIVar6);
      pDVar9 = Pass::get_def_use_mgr((Pass *)this);
      pIVar6 = BasicBlock::GetLabelInst(local_270);
      analysis::DefUseManager::AnalyzeInstUse(pDVar9,pIVar6);
      __gnu_cxx::
      __normal_iterator<spvtools::opt::BasicBlock_*const_*,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>
      ::operator++(&__end2_1);
    }
    pDVar9 = Pass::get_def_use_mgr((Pass *)this);
    pvVar8 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                       ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_38);
    pIVar6 = BasicBlock::GetLabelInst(pvVar8);
    analysis::DefUseManager::AnalyzeInstDefUse(pDVar9,pIVar6);
    std::vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_>::~vector
              ((vector<spvtools::opt::Operand,_std::allocator<spvtools::opt::Operand>_> *)&__range2)
    ;
  }
  return;
}

Assistant:

void MergeReturnPass::MergeReturnBlocks(
    Function* function, const std::vector<BasicBlock*>& return_blocks) {
  if (return_blocks.size() <= 1) {
    // No work to do.
    return;
  }

  CreateReturnBlock();
  uint32_t return_id = final_return_block_->id();
  auto ret_block_iter = --function->end();
  // Create the PHI for the merged block (if necessary).
  // Create new return.
  std::vector<Operand> phi_ops;
  for (auto block : return_blocks) {
    if (block->tail()->opcode() == spv::Op::OpReturnValue) {
      phi_ops.push_back(
          {SPV_OPERAND_TYPE_ID, {block->tail()->GetSingleWordInOperand(0u)}});
      phi_ops.push_back({SPV_OPERAND_TYPE_ID, {block->id()}});
    }
  }

  if (!phi_ops.empty()) {
    // Need a PHI node to select the correct return value.
    uint32_t phi_result_id = TakeNextId();
    uint32_t phi_type_id = function->type_id();
    std::unique_ptr<Instruction> phi_inst(new Instruction(
        context(), spv::Op::OpPhi, phi_type_id, phi_result_id, phi_ops));
    ret_block_iter->AddInstruction(std::move(phi_inst));
    BasicBlock::iterator phiIter = ret_block_iter->tail();

    std::unique_ptr<Instruction> return_inst(
        new Instruction(context(), spv::Op::OpReturnValue, 0u, 0u,
                        {{SPV_OPERAND_TYPE_ID, {phi_result_id}}}));
    ret_block_iter->AddInstruction(std::move(return_inst));
    BasicBlock::iterator ret = ret_block_iter->tail();

    // Register the phi def and mark instructions for use updates.
    get_def_use_mgr()->AnalyzeInstDefUse(&*phiIter);
    get_def_use_mgr()->AnalyzeInstDef(&*ret);
  } else {
    std::unique_ptr<Instruction> return_inst(
        new Instruction(context(), spv::Op::OpReturn));
    ret_block_iter->AddInstruction(std::move(return_inst));
  }

  // Replace returns with branches
  for (auto block : return_blocks) {
    context()->ForgetUses(block->terminator());
    block->tail()->SetOpcode(spv::Op::OpBranch);
    block->tail()->ReplaceOperands({{SPV_OPERAND_TYPE_ID, {return_id}}});
    get_def_use_mgr()->AnalyzeInstUse(block->terminator());
    get_def_use_mgr()->AnalyzeInstUse(block->GetLabelInst());
  }

  get_def_use_mgr()->AnalyzeInstDefUse(ret_block_iter->GetLabelInst());
}